

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_resetCCtx_byCopyingCDict
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_buffered_policy_e zbuff)

{
  uint uVar1;
  int iVar2;
  ZSTD_compressionParameters *cParams;
  long lVar3;
  void *__src;
  void *__dest;
  long in_RSI;
  long in_RDI;
  int in_stack_0000000c;
  undefined4 uStack0000000000000010;
  undefined8 uStack0000000000000014;
  ZSTD_matchState_t *pZStack000000000000001c;
  ZSTD_matchState_t *dstMatchState;
  ZSTD_matchState_t *srcMatchState;
  size_t h3Size;
  int h3log;
  size_t tagTableSize;
  size_t hSize;
  size_t chainSize;
  size_t err_code;
  uint windowLog;
  ZSTD_compressionParameters *cdict_cParams;
  ZSTD_CCtx_params *in_stack_00000090;
  undefined4 uVar4;
  ZSTD_CCtx *in_stack_00000098;
  U32 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 *tableSize;
  U32 *in_stack_ffffffffffffff88;
  U32 *in_stack_ffffffffffffff90;
  size_t local_8;
  
  tableSize = &stack0x00000008;
  if (*(int *)(in_RSI + 0xf4) != 0) {
    __assert_fail("!cdict->matchState.dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x59eb,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (in_stack_0000000c == 0) {
    __assert_fail("windowLog != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x59f0,
                  "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                 );
  }
  uStack0000000000000014 = *(undefined8 *)(in_RSI + 0x170);
  pZStack000000000000001c = *(ZSTD_matchState_t **)(in_RSI + 0x178);
  dstMatchState._4_4_ = *(undefined4 *)(in_RSI + 0x180);
  uStack0000000000000010 = (undefined4)((ulong)*(undefined8 *)(in_RSI + 0x168) >> 0x20);
  uVar4 = *(undefined4 *)(in_RSI + 0x17b8);
  local_8 = ZSTD_resetCCtx_internal
                      (in_stack_00000098,in_stack_00000090,(U64)cctx,(size_t)cdict,
                       pledgedSrcSize._4_4_,(ZSTD_buffered_policy_e)pledgedSrcSize);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    if (*(int *)(in_RDI + 0xfc) != *(int *)(in_RSI + 0x180)) {
      __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x59f8,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if (*(int *)(in_RDI + 0xec) != *(int *)(in_RSI + 0x170)) {
      __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x59f9,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if (*(int *)(in_RDI + 0xe8) != *(int *)(in_RSI + 0x16c)) {
      __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x59fa,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    ZSTD_cwksp_mark_tables_dirty((ZSTD_cwksp *)0x2c37a9);
    if (*(int *)(tableSize + 0x90) == 0) {
      __assert_fail("params.useRowMatchFinder != ZSTD_ps_auto",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x59fe,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    iVar2 = ZSTD_allocateChainTable
                      ((ZSTD_strategy)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (ZSTD_paramSwitch_e)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    if (iVar2 == 0) {
      cParams = (ZSTD_compressionParameters *)0x0;
    }
    else {
      cParams = (ZSTD_compressionParameters *)(1L << ((byte)*(undefined4 *)(in_RSI + 0x16c) & 0x3f))
      ;
    }
    uVar4 = *(undefined4 *)(in_RSI + 0x170);
    ZSTD_copyCDictTableIntoCCtx
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)tableSize,cParams);
    iVar2 = ZSTD_allocateChainTable
                      ((ZSTD_strategy)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (ZSTD_paramSwitch_e)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    if (iVar2 != 0) {
      ZSTD_copyCDictTableIntoCCtx
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)tableSize,cParams);
    }
    iVar2 = ZSTD_rowMatchFinderUsed
                      ((ZSTD_strategy)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (ZSTD_paramSwitch_e)in_stack_ffffffffffffff70);
    if (iVar2 != 0) {
      memcpy(*(void **)(in_RDI + 0xcb0),*(void **)(in_RSI + 0xa0),1L << ((byte)uVar4 & 0x3f));
      *(undefined8 *)(in_RDI + 0xcd8) = *(undefined8 *)(in_RSI + 200);
    }
    if (*(int *)(in_RDI + 0xca8) == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = 1L << ((byte)*(int *)(in_RDI + 0xca8) & 0x3f);
    }
    if (*(int *)(in_RSI + 0x98) != 0) {
      __assert_fail("cdict->matchState.hashLog3 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5a1d,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    memset(*(void **)(in_RDI + 0xcf0),0,lVar3 << 2);
    ZSTD_cwksp_mark_tables_clean((ZSTD_cwksp *)0x2c39d5);
    __src = (void *)(in_RSI + 0x68);
    __dest = (void *)(in_RDI + 0xc78);
    memcpy(__dest,__src,0x28);
    *(undefined4 *)((long)__dest + 0x2c) = *(undefined4 *)((long)__src + 0x2c);
    *(undefined4 *)((long)__dest + 0x28) = *(undefined4 *)((long)__src + 0x28);
    *(undefined4 *)(in_RDI + 0x280) = *(undefined4 *)(in_RSI + 0x17b0);
    *(undefined8 *)(in_RDI + 0x288) = *(undefined8 *)(in_RSI + 8);
    memcpy(*(void **)(in_RDI + 0xc68),(void *)(in_RSI + 0x198),0x1600);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx* cctx,
                            const ZSTD_CDict* cdict,
                            ZSTD_CCtx_params params,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{
    const ZSTD_compressionParameters *cdict_cParams = &cdict->matchState.cParams;

    assert(!cdict->matchState.dedicatedDictSearch);
    DEBUGLOG(4, "ZSTD_resetCCtx_byCopyingCDict() pledgedSrcSize=%llu",
                (unsigned long long)pledgedSrcSize);

    {   unsigned const windowLog = params.cParams.windowLog;
        assert(windowLog != 0);
        /* Copy only compression parameters related to tables. */
        params.cParams = *cdict_cParams;
        params.cParams.windowLog = windowLog;
        params.useRowMatchFinder = cdict->useRowMatchFinder;
        FORWARD_IF_ERROR(ZSTD_resetCCtx_internal(cctx, &params, pledgedSrcSize,
                                                 /* loadedDictSize */ 0,
                                                 ZSTDcrp_leaveDirty, zbuff), "");
        assert(cctx->appliedParams.cParams.strategy == cdict_cParams->strategy);
        assert(cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog);
        assert(cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog);
    }

    ZSTD_cwksp_mark_tables_dirty(&cctx->workspace);
    assert(params.useRowMatchFinder != ZSTD_ps_auto);

    /* copy tables */
    {   size_t const chainSize = ZSTD_allocateChainTable(cdict_cParams->strategy, cdict->useRowMatchFinder, 0 /* DDS guaranteed disabled */)
                                                            ? ((size_t)1 << cdict_cParams->chainLog)
                                                            : 0;
        size_t const hSize =  (size_t)1 << cdict_cParams->hashLog;

        ZSTD_copyCDictTableIntoCCtx(cctx->blockState.matchState.hashTable,
                                cdict->matchState.hashTable,
                                hSize, cdict_cParams);

        /* Do not copy cdict's chainTable if cctx has parameters such that it would not use chainTable */
        if (ZSTD_allocateChainTable(cctx->appliedParams.cParams.strategy, cctx->appliedParams.useRowMatchFinder, 0 /* forDDSDict */)) {
            ZSTD_copyCDictTableIntoCCtx(cctx->blockState.matchState.chainTable,
                                    cdict->matchState.chainTable,
                                    chainSize, cdict_cParams);
        }
        /* copy tag table */
        if (ZSTD_rowMatchFinderUsed(cdict_cParams->strategy, cdict->useRowMatchFinder)) {
            size_t const tagTableSize = hSize;
            ZSTD_memcpy(cctx->blockState.matchState.tagTable,
                        cdict->matchState.tagTable,
                        tagTableSize);
            cctx->blockState.matchState.hashSalt = cdict->matchState.hashSalt;
        }
    }

    /* Zero the hashTable3, since the cdict never fills it */
    {   int const h3log = cctx->blockState.matchState.hashLog3;
        size_t const h3Size = h3log ? ((size_t)1 << h3log) : 0;
        assert(cdict->matchState.hashLog3 == 0);
        ZSTD_memset(cctx->blockState.matchState.hashTable3, 0, h3Size * sizeof(U32));
    }

    ZSTD_cwksp_mark_tables_clean(&cctx->workspace);

    /* copy dictionary offsets */
    {   ZSTD_matchState_t const* srcMatchState = &cdict->matchState;
        ZSTD_matchState_t* dstMatchState = &cctx->blockState.matchState;
        dstMatchState->window       = srcMatchState->window;
        dstMatchState->nextToUpdate = srcMatchState->nextToUpdate;
        dstMatchState->loadedDictEnd= srcMatchState->loadedDictEnd;
    }

    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;

    /* copy block state */
    ZSTD_memcpy(cctx->blockState.prevCBlock, &cdict->cBlockState, sizeof(cdict->cBlockState));

    return 0;
}